

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O0

void __thiscall
jsoncons::typed_array_visitor<std::vector<float,_std::allocator<float>_>_>::visit_half_
          (void *param_1)

{
  uint16_t unaff_retaddr;
  value_type_conflict9 *in_stack_ffffffffffffffd8;
  vector<float,_std::allocator<float>_> *this;
  
  this = *(vector<float,_std::allocator<float>_> **)((long)param_1 + 8);
  binary::decode_half(unaff_retaddr);
  std::vector<float,_std::allocator<float>_>::push_back(this,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void visit_half_(std::false_type, uint16_t value)
        {
            v_.push_back(static_cast<value_type>(binary::decode_half(value)));
        }